

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall
slang::parsing::Lexer::scanEncodedText
          (Lexer *this,ProtectEncoding encoding,uint32_t expectedBytes,bool singleLine,
          bool legacyProtectedMode)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  char cVar1;
  char cVar2;
  bool bVar3;
  char *__str;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  Lexer *in_RDI;
  byte in_R8B;
  double dVar4;
  int i_1;
  uint32_t i;
  uint32_t encodedCount;
  uint32_t count;
  char c;
  uint32_t byteCount;
  anon_class_24_3_ac0d555d invalidByte;
  anon_class_16_2_98147aed lookingAtPragma;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar6;
  undefined1 in_stack_ffffffffffffff48 [16];
  undefined1 in_stack_ffffffffffffff68 [16];
  int local_84;
  uint local_6c;
  uint local_44;
  Lexer *pLVar7;
  char invalidChar;
  anon_class_24_3_ac0d555d *this_00;
  undefined1 *puVar8;
  Lexer *pLVar9;
  byte local_12;
  byte local_11;
  uint local_10;
  uint local_c;
  
  local_11 = in_CL & 1;
  local_12 = in_R8B & 1;
  pLVar9 = (Lexer *)&stack0xffffffffffffffee;
  this_00 = (anon_class_24_3_ac0d555d *)&stack0xffffffffffffffd8;
  puVar8 = &stack0xffffffffffffffef;
  local_44 = 0;
  uVar5 = local_44;
  pLVar7 = in_RDI;
  local_10 = in_EDX;
  local_c = in_ESI;
  do {
    while( true ) {
      local_44 = uVar5;
      if (((local_10 != 0) && (local_10 <= local_44)) && ((local_11 & 1) == 0)) {
        if (local_44 != local_10) {
          currentOffset(in_RDI);
          uVar5 = (uint)((ulong)in_RDI >> 0x20);
          addDiag(in_stack_ffffffffffffff48._0_8_,in_stack_ffffffffffffff48._12_4_,
                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     uVar5);
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     uVar5);
        }
        return;
      }
      cVar1 = peek(in_RDI);
      uVar5 = local_44;
      if ((cVar1 != '\r') && (cVar1 != '\n')) break;
      if ((local_11 & 1) != 0) {
        if (local_10 == 0) {
          return;
        }
        if (local_44 == local_10) {
          return;
        }
        currentOffset(in_RDI);
        uVar5 = (uint)((ulong)in_RDI >> 0x20);
        addDiag(in_stack_ffffffffffffff48._0_8_,in_stack_ffffffffffffff48._12_4_,
                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        Diagnostic::operator<<<unsigned_int>
                  ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),uVar5
                  );
        Diagnostic::operator<<<unsigned_int>
                  ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),uVar5
                  );
        return;
      }
      advance(in_RDI);
      if ((cVar1 == '\r') && (cVar2 = peek(in_RDI), cVar2 == '\n')) {
        advance(in_RDI);
      }
      if (((local_c == 2) && (uVar5 = local_44 + 1, cVar1 == '\r')) &&
         (cVar1 = peek(in_RDI,-1), cVar1 == '\n')) {
        uVar5 = local_44 + 2;
      }
    }
    if (((local_10 == 0) && ((local_11 & 1) == 0)) &&
       ((cVar1 == '`' &&
        (bVar3 = scanEncodedText::anon_class_16_2_98147aed::operator()
                           (in_stack_ffffffffffffff68._0_8_), bVar3)))) {
      return;
    }
    cVar2 = (char)((ulong)pLVar7 >> 0x38);
    __str = (char *)(ulong)local_c;
    switch(__str) {
    case (char *)0x0:
      if (cVar1 == '`') {
        advance(in_RDI);
      }
      else {
        if ((cVar1 < ' ') || ('M' < cVar1)) {
          sv(__str,CONCAT17(cVar1,CONCAT16(in_stack_ffffffffffffff2e,
                                           CONCAT15(in_stack_ffffffffffffff2d,
                                                    CONCAT14(in_stack_ffffffffffffff2c,
                                                             in_stack_ffffffffffffff28)))));
          name._M_str = (char *)pLVar9;
          name._M_len = (size_t)puVar8;
          scanEncodedText::anon_class_24_3_ac0d555d::operator()(this_00,cVar2,name);
          return;
        }
        advance(in_RDI);
        dVar4 = ceil((double)(uint)((cVar1 + -0x20) * 4) / 3.0);
        for (local_6c = 0; uVar5 = local_44 + cVar1 + -0x20, local_6c < (uint)(long)dVar4;
            local_6c = local_6c + 1) {
          cVar2 = peek(in_RDI);
          invalidChar = (char)((ulong)pLVar7 >> 0x38);
          if ((cVar2 < ' ') || ('`' < cVar2)) {
            sv(__str,CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(cVar2,CONCAT15(in_stack_ffffffffffffff2d,
                                                      CONCAT14(in_stack_ffffffffffffff2c,
                                                               in_stack_ffffffffffffff28)))));
            name_00._M_str = (char *)pLVar9;
            name_00._M_len = (size_t)puVar8;
            scanEncodedText::anon_class_24_3_ac0d555d::operator()(this_00,invalidChar,name_00);
            return;
          }
          advance(in_RDI);
        }
      }
      break;
    case (char *)0x1:
      local_44 = local_44 + 3;
      for (local_84 = 0; uVar5 = local_44, local_84 < 4; local_84 = local_84 + 1) {
        cVar1 = peek(in_RDI);
        if ((local_84 < 2) || (cVar1 != '=')) {
          bVar3 = isBase64Char('\0');
          cVar2 = (char)((ulong)pLVar7 >> 0x38);
          if (!bVar3) {
            sv(__str,CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,
                                       CONCAT15(cVar1,CONCAT14(in_stack_ffffffffffffff2c,
                                                               in_stack_ffffffffffffff28)))));
            name_01._M_str = (char *)pLVar9;
            name_01._M_len = (size_t)puVar8;
            scanEncodedText::anon_class_24_3_ac0d555d::operator()(this_00,cVar2,name_01);
            return;
          }
        }
        else {
          local_44 = local_44 - 1;
        }
        advance(in_RDI);
      }
      break;
    case (char *)0x2:
      bVar3 = isPrintableASCII(cVar1);
      cVar2 = (char)((ulong)pLVar7 >> 0x38);
      if ((!bVar3) && (cVar1 != '\t')) {
        sv(__str,CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,
                                   CONCAT15(in_stack_ffffffffffffff2d,
                                            CONCAT14(cVar1,in_stack_ffffffffffffff28)))));
        name_02._M_str = (char *)pLVar9;
        name_02._M_len = (size_t)puVar8;
        scanEncodedText::anon_class_24_3_ac0d555d::operator()(this_00,cVar2,name_02);
        return;
      }
      advance(in_RDI);
      if (cVar1 == '=') {
        cVar1 = peek(in_RDI);
        if ((cVar1 == '\r') || (cVar1 == '\n')) {
          advance(in_RDI);
          if ((cVar1 == '\r') && (cVar1 = peek(in_RDI), cVar1 == '\n')) {
            advance(in_RDI);
          }
          break;
        }
        bVar3 = isHexDigit(cVar1);
        cVar2 = (char)((ulong)pLVar7 >> 0x38);
        if (!bVar3) {
LAB_0040994d:
          sv(__str,CONCAT17(in_stack_ffffffffffffff2f,
                            CONCAT16(in_stack_ffffffffffffff2e,
                                     CONCAT15(in_stack_ffffffffffffff2d,
                                              CONCAT14(in_stack_ffffffffffffff2c,
                                                       CONCAT13(cVar1,(int3)
                                                  in_stack_ffffffffffffff28))))));
          name_03._M_str = (char *)pLVar9;
          name_03._M_len = (size_t)puVar8;
          scanEncodedText::anon_class_24_3_ac0d555d::operator()(this_00,cVar2,name_03);
          return;
        }
        cVar2 = peek(in_RDI,1);
        bVar3 = isHexDigit(cVar2);
        cVar2 = (char)((ulong)pLVar7 >> 0x38);
        if (!bVar3) goto LAB_0040994d;
        advance(in_RDI,2);
      }
      uVar5 = local_44 + 1;
      break;
    case (char *)0x3:
      if ((cVar1 == '\0') && (bVar3 = reallyAtEnd(in_RDI), bVar3)) {
        uVar6 = 0x170002;
        currentOffset(in_RDI);
        addDiag(in_stack_ffffffffffffff48._0_8_,in_stack_ffffffffffffff48._12_4_,
                CONCAT44(uVar6,in_stack_ffffffffffffff40));
        return;
      }
      advance(in_RDI);
      uVar5 = local_44 + 1;
    }
  } while( true );
}

Assistant:

void Lexer::scanEncodedText(ProtectEncoding encoding, uint32_t expectedBytes, bool singleLine,
                            bool legacyProtectedMode) {
    // Helper function that returns true if the current position in the buffer
    // is looking at the string "pragma".
    auto lookingAtPragma = [&] {
        int index = 0;
        auto endStr = legacyProtectedMode ? "endprotected"sv : "pragma"sv;
        for (char c : endStr) {
            if (peek(++index) != c)
                return false;
        }
        return true;
    };

    auto invalidByte = [&](char invalidChar, std::string_view name) {
        auto& diag = addDiag(diag::InvalidEncodingByte, currentOffset()) << name;
        diag << (isPrintableASCII(invalidChar) ? std::string(1, invalidChar)
                                               : fmt::format("{:#04x}", invalidChar));

        // Try to skip ahead to the next `pragma directive to get us out of this region.
        while (true) {
            char c = peek();
            if (c == '\0' && reallyAtEnd())
                break;

            if (c == '`' && lookingAtPragma())
                break;

            if (singleLine && (c == '\r' || c == '\n'))
                break;

            advance();
        }
    };

    uint32_t byteCount = 0;
    while (true) {
        if (expectedBytes && byteCount >= expectedBytes && !singleLine) {
            if (byteCount != expectedBytes) {
                addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                    << byteCount << expectedBytes;
            }
            return;
        }

        char c = peek();
        if (c == '\r' || c == '\n') {
            // If this is a single line region then we're done here.
            if (singleLine) {
                if (expectedBytes && byteCount != expectedBytes) {
                    addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                        << byteCount << expectedBytes;
                }
                return;
            }

            // Otherwise continue on. This newline doesn't count toward our expected byte limit,
            // unless this is the quoted printable encoding.
            advance();
            if (c == '\r' && peek() == '\n')
                advance();

            if (encoding == ProtectEncoding::QuotedPrintable) {
                byteCount++;
                if (c == '\r' && peek(-1) == '\n')
                    byteCount++;
            }

            continue;
        }

        if (!expectedBytes && !singleLine && c == '`') {
            // Encoding tools probably shouldn't do this but if they do we
            // should try to gracefully guess the end of the region by looking
            // for another non-encoded pragma that ends it.
            if (lookingAtPragma())
                return;
        }

        switch (encoding) {
            case ProtectEncoding::UUEncode: {
                // uuencode tells us the length of the line up front, so use that
                // to read the whole line in one go. The encoding is invalid if that
                // doesn't match up with what we find in the data.
                if (c == '`') {
                    // The grave character is a special case meaning 0 characters on this line.
                    advance();
                    continue;
                }

                if (c < 0x20 || c > 0x20 + 45) {
                    invalidByte(c, "uuencode"sv);
                    return;
                }

                uint32_t count = uint32_t(c - 0x20);
                byteCount += count;
                advance();

                uint32_t encodedCount = (uint32_t)ceil(count * 4 / 3.0);
                for (uint32_t i = 0; i < encodedCount; i++) {
                    c = peek();
                    if (c < 0x20 || c > 0x60) {
                        invalidByte(c, "uuencode"sv);
                        return;
                    }
                    advance();
                }
                break;
            }
            case ProtectEncoding::Base64:
                byteCount += 3;
                for (int i = 0; i < 4; i++) {
                    c = peek();
                    if (i > 1 && c == '=') {
                        byteCount--;
                    }
                    else if (!isBase64Char(c)) {
                        invalidByte(c, "base64"sv);
                        return;
                    }

                    advance();
                }
                break;
            case ProtectEncoding::QuotedPrintable:
                if (!isPrintableASCII(c) && c != '\t') {
                    invalidByte(c, "quoted-printable"sv);
                    return;
                }

                advance();
                if (c == '=') {
                    // If this is a soft line break then it doesn't count
                    // towards our byte count. Otherwise this is an escaped
                    // character that does count.
                    c = peek();
                    if (c == '\r' || c == '\n') {
                        advance();
                        if (c == '\r' && peek() == '\n')
                            advance();
                        continue;
                    }

                    if (!isHexDigit(c) || !isHexDigit(peek(1))) {
                        invalidByte(c, "quoted-printable"sv);
                        return;
                    }

                    advance(2);
                }
                byteCount++;
                break;
            case ProtectEncoding::Raw:
                if (c == '\0' && reallyAtEnd()) {
                    addDiag(diag::RawProtectEOF, currentOffset() - 1);
                    return;
                }

                advance();
                byteCount++;
                break;
        }
    }
}